

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O3

void __thiscall libtorrent::aux::utp_socket_impl::tick(utp_socket_impl *this,time_point now)

{
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  session_settings *psVar4;
  utp_socket_manager *puVar5;
  bool bVar6;
  char cVar7;
  ushort uVar8;
  int iVar9;
  packet *ppVar10;
  long lVar11;
  uint16_t uVar12;
  undefined8 uVar13;
  long lVar14;
  uint uVar15;
  index_type idx;
  unique_lock<std::mutex> local_40;
  
  if ((*(ushort *)&this->field_0x21c & 0x18) == 0x10) {
    return;
  }
  if ((long)now.__d.__r <= (this->m_timeout).__d.__r) {
    return;
  }
  uVar2 = this->m_acked_seq_nr;
  if ((((uint16_t)(uVar2 + 1) == this->m_mtu_seq) && (uVar2 != -1)) &&
     (this->m_seq_nr == (uint16_t)(uVar2 + 2))) {
    this->m_mtu_ceiling = this->m_mtu - 1;
    update_mtu_limits(this);
    bVar6 = true;
    if (((this->m_outbuf).m_size != 0) || (this->m_close_reason != none)) {
LAB_0038fc10:
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa4,1);
    }
  }
  else {
    if (((this->m_outbuf).m_size != 0) || (this->m_close_reason != none)) {
      this->m_num_timeouts = this->m_num_timeouts + '\x01';
      bVar6 = false;
      goto LAB_0038fc10;
    }
    bVar6 = false;
  }
  bVar1 = this->m_num_timeouts;
  psVar4 = this->m_sm->m_sett;
  local_40._M_device = &psVar4->m_mutex;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar9 = (psVar4->m_store).m_ints._M_elems[0x5c];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (((int)(uint)bVar1 <= iVar9) &&
     ((this->m_num_timeouts == '\0' || (*(short *)&this->field_0x21c < 0)))) {
    if (bVar6) {
      uVar12 = this->m_seq_nr;
    }
    else {
      if (this->m_bytes_in_flight == 0) {
        uVar8 = this->m_mtu;
        if (this->m_cwnd >> 0x10 < (long)(ulong)uVar8) goto LAB_0038fcfd;
        lVar11 = (this->m_cwnd * 2) / 3;
        lVar14 = (ulong)uVar8 * 0x10000;
        if (lVar11 == lVar14 ||
            SBORROW8(lVar11,lVar14) != (long)(lVar11 + (ulong)uVar8 * -0x10000) < 0) {
          lVar11 = lVar14;
        }
        this->m_cwnd = lVar11;
      }
      else {
        uVar8 = this->m_mtu;
LAB_0038fcfd:
        this->m_cwnd = (ulong)uVar8 << 0x10;
      }
      iVar9 = packet_timeout(this);
      (this->m_timeout).__d.__r = (long)iVar9 * 1000000 + (long)now.__d.__r;
      uVar12 = this->m_seq_nr;
      this->m_loss_seq_nr = uVar12;
      this->field_0x21d = this->field_0x21d | 2;
    }
    this->m_mtu_seq = 0;
    uVar8 = this->m_acked_seq_nr;
    if (uVar8 != (ushort)(uVar12 + 1)) {
      idx = (index_type)uVar8;
      do {
        ppVar10 = packet_buffer::at(&this->m_outbuf,idx);
        if ((ppVar10 != (packet *)0x0) && ((ppVar10->field_0xe & 0x40) == 0)) {
          ppVar10->field_0xe = ppVar10->field_0xe | 0x40;
          this->m_bytes_in_flight =
               this->m_bytes_in_flight + ((uint)ppVar10->header_size - (uint)ppVar10->size);
        }
        uVar15 = idx + 1;
        idx = uVar15 & 0xffff;
      } while ((uint16_t)(this->m_seq_nr + 1) != (short)uVar15);
      uVar8 = this->m_acked_seq_nr;
    }
    ppVar10 = packet_buffer::at(&this->m_outbuf,(uint)(ushort)(uVar8 + 1));
    if (ppVar10 == (packet *)0x0) {
      uVar8 = *(ushort *)&this->field_0x21c & 0x1c;
      if (uVar8 < 0xc) {
        send_pkt(this,0);
        return;
      }
      if (uVar8 != 0xc) {
        return;
      }
      if ((DAT_004ecee8 == -0x70502de1da3a1f65) || (DAT_004ecee8 == -0x4d54ee85da8120f3)) {
LAB_0038ff09:
        uVar13 = 0x100000002;
      }
      else {
        cVar7 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                          (&boost::asio::error::get_misc_category()::instance,2);
        uVar13 = 2;
        if (cVar7 != '\0') goto LAB_0038ff09;
      }
      (this->m_error).val_ = (int)uVar13;
      (this->m_error).failed_ = (bool)(char)((ulong)uVar13 >> 0x20);
      *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar13 >> 0x28);
      (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
      goto LAB_0038fc99;
    }
    bVar1 = ppVar10->field_0xe;
    iVar9 = utp_socket_manager::num_resends(this->m_sm);
    if ((int)(bVar1 & 0x3f) < iVar9) {
      uVar8 = *(ushort *)&this->field_0x21c;
      if ((uVar8 & 0x1c) == 4) {
        bVar1 = ppVar10->field_0xe;
        iVar9 = utp_socket_manager::syn_resends(this->m_sm);
        if (iVar9 <= (int)(bVar1 & 0x3f)) goto LAB_0038fe40;
        uVar8 = *(ushort *)&this->field_0x21c;
      }
      if (((uVar8 & 0x1c) != 0xc) ||
         (bVar1 = ppVar10->field_0xe, iVar9 = utp_socket_manager::fin_resends(this->m_sm),
         (int)(bVar1 & 0x3f) < iVar9)) {
        uVar3 = this->m_acked_seq_nr;
        if (this->m_fast_resend_seq_nr == (uint16_t)(uVar3 + 1)) {
          this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
        }
        resend_packet(this,ppVar10,false);
        return;
      }
    }
LAB_0038fe40:
    if (this->m_mtu_floor < ppVar10->size) {
      puVar5 = this->m_sm;
      (puVar5->m_restrict_mtu)._M_elems[puVar5->m_mtu_idx] = (uint)this->m_mtu;
      puVar5->m_mtu_idx = puVar5->m_mtu_idx + ((puVar5->m_mtu_idx + 1) / 3) * -3 + 1;
    }
  }
  (this->m_error).val_ = 0x6e;
  (this->m_error).failed_ = true;
  *(undefined3 *)&(this->m_error).field_0x5 = 0;
  (this->m_error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
LAB_0038fc99:
  set_state(this,error_wait);
  test_socket_state(this);
  return;
}

Assistant:

state_t state() const { return static_cast<state_t>(m_state); }